

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void __thiscall CConsole::ParseArguments(CConsole *this,int NumArgs,char **ppArguments)

{
  int iVar1;
  int iVar2;
  
  if (0 < NumArgs) {
    iVar2 = 0;
    do {
      iVar1 = str_comp("-f",ppArguments[iVar2]);
      if (iVar1 == 0) {
        if (1 < NumArgs - iVar2) {
          (*(this->super_IConsole).super_IInterface._vptr_IInterface[0x16])
                    (this,ppArguments[(long)iVar2 + 1]);
        }
        iVar2 = iVar2 + 1;
      }
      else {
        iVar1 = str_comp("-s",ppArguments[iVar2]);
        if ((((iVar1 != 0) && (iVar1 = str_comp("--silent",ppArguments[iVar2]), iVar1 != 0)) &&
            (iVar1 = str_comp("-d",ppArguments[iVar2]), iVar1 != 0)) &&
           (iVar1 = str_comp("--default",ppArguments[iVar2]), iVar1 != 0)) {
          (*(this->super_IConsole).super_IInterface._vptr_IInterface[0x13])(this,ppArguments[iVar2])
          ;
        }
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < NumArgs);
  }
  return;
}

Assistant:

void CConsole::ParseArguments(int NumArgs, const char **ppArguments)
{
	for(int i = 0; i < NumArgs; i++)
	{
		// check for scripts to execute
		if(str_comp("-f", ppArguments[i]) == 0)
		{
			if(NumArgs - i > 1)
				ExecuteFile(ppArguments[i+1]);
			i++;
		}
		else if(!str_comp("-s", ppArguments[i]) || !str_comp("--silent", ppArguments[i]) ||
				!str_comp("-d", ppArguments[i]) || !str_comp("--default", ppArguments[i]))
		{
			// skip silent, default param
			continue;
		}
		else
		{
			// search arguments for overrides
			ExecuteLine(ppArguments[i]);
		}
	}
}